

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::Fsmooth
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs)

{
  double *pdVar1;
  Real RVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  double dVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  double dVar15;
  double dVar16;
  _func_int **pp_Var17;
  _func_int **pp_Var18;
  _func_int **pp_Var19;
  _func_int **pp_Var20;
  _func_int **pp_Var21;
  _func_int **pp_Var22;
  double dVar23;
  _func_int **pp_Var24;
  _func_int **pp_Var25;
  _func_int **pp_Var26;
  double dVar27;
  _func_int **pp_Var28;
  _func_int **pp_Var29;
  _func_int **pp_Var30;
  _func_int **pp_Var31;
  _func_int **pp_Var32;
  _func_int **pp_Var33;
  _func_int **pp_Var34;
  _func_int **pp_Var35;
  _func_int **pp_Var36;
  _func_int **pp_Var37;
  _func_int **pp_Var38;
  _func_int **pp_Var39;
  FabArray<amrex::IArrayBox> *this_00;
  pointer pIVar40;
  double dVar41;
  undefined1 auVar42 [16];
  uint uVar43;
  int iVar44;
  FabArrayBase *pFVar45;
  undefined8 uVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  FabArrayBase *pFVar55;
  long lVar56;
  ulong uVar57;
  undefined8 *puVar58;
  FabArrayBase *pFVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long *plVar68;
  long lVar69;
  long lVar70;
  int iVar71;
  long lVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  bool bVar76;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> _Var77;
  double dVar78;
  double dVar79;
  double dVar80;
  undefined1 auVar81 [16];
  double dVar82;
  double dVar83;
  FabArrayBase *pFVar84;
  double dVar85;
  Real facz;
  Real facy;
  Real facx;
  Real f2x2ymz;
  MFIter mfi_2;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> a_ls;
  MFIter mfi;
  FabArrayBase *local_b78;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_b50;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_b28;
  FabArrayBase *local_b10;
  FabArrayBase *local_af8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_af0;
  Array4<const_double> local_a90;
  undefined8 local_a50;
  FabArrayBase *local_a48;
  FabArrayBase *local_a40;
  size_t local_a38;
  FabArrayBase *local_a30;
  FabArrayBase *local_a28;
  long local_a20;
  _func_int ***local_a18;
  FabArrayBase *local_a10;
  FabArrayBase *local_a08;
  _func_int ***local_a00;
  FabArrayBase *local_9f8;
  _func_int ***local_9f0;
  _func_int ***local_9e8;
  _func_int ***local_9e0;
  int local_9d4;
  int local_9d0;
  uint local_9cc;
  Array4<const_double> local_9c8;
  undefined1 local_988 [16];
  FabArrayBase *local_978;
  FabArrayBase *pFStack_970;
  FabArrayBase *local_960;
  double local_958;
  int local_94c;
  uint local_948;
  uint local_944;
  uint local_940;
  int local_93c;
  Array4<const_double> local_938;
  ulong local_8f8;
  long local_8f0;
  Array4<const_int> local_8e8;
  undefined1 local_8a8 [24];
  FabArrayBase *pFStack_890;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_874;
  uint local_870;
  undefined4 uStack_86c;
  double local_848;
  double dStack_840;
  Box local_834;
  double local_818;
  double dStack_810;
  undefined1 local_808 [16];
  FabArrayBase *local_7f8;
  FabArrayBase *pFStack_7f0;
  ulong local_7e0;
  long local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  FabArrayBase *local_7c0;
  long local_7b8;
  double local_7b0;
  undefined1 local_7a8 [40];
  int iStack_780;
  int iStack_77c;
  int iStack_778;
  undefined8 uStack_774;
  undefined1 local_6a8 [24];
  FabArrayBase *pFStack_690;
  int local_688;
  int iStack_684;
  int iStack_680;
  int iStack_67c;
  IndexType IStack_678;
  undefined8 uStack_674;
  undefined1 local_5a8 [40];
  int iStack_580;
  int iStack_57c;
  int iStack_578;
  undefined8 uStack_574;
  undefined1 local_4a8 [24];
  FabArrayBase *pFStack_490;
  FabArrayBase *pFStack_488;
  undefined8 uStack_474;
  _Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_468;
  FabArrayBase *pFStack_460;
  FabArrayBase *local_458;
  FabArrayBase *pFStack_450;
  FabArrayBase *pFStack_448;
  undefined8 uStack_434;
  _Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_428;
  tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> tStack_420;
  FabArrayBase *local_418;
  FabArrayBase *pFStack_410;
  FabArrayBase *pFStack_408;
  int iStack_400;
  int local_3fc;
  undefined8 uStack_3f8;
  uint uStack_3f0;
  int iStack_3ec;
  int local_3e8;
  undefined4 uStack_3e4;
  FabArrayBase *pFStack_3e0;
  FabArrayBase *local_3d8;
  FabArrayBase *pFStack_3d0;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int iStack_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  undefined8 uStack_3a8;
  int iStack_3a0;
  undefined4 uStack_39c;
  FabArrayBase *local_398;
  FabArrayBase *pFStack_390;
  int iStack_388;
  int iStack_384;
  int local_380;
  int iStack_37c;
  int iStack_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int iStack_368;
  undefined8 uStack_360;
  int iStack_358;
  undefined4 uStack_354;
  FabArrayBase *local_350;
  FabArrayBase *pFStack_348;
  FabArrayBase *local_340;
  FabArrayBase *pFStack_338;
  int local_324;
  int iStack_320;
  double dStack_318;
  FabArrayBase *local_310;
  FabArrayBase *pFStack_308;
  FabArrayBase *local_300;
  FabArrayBase *pFStack_2f8;
  FabArrayBase *pFStack_2f0;
  undefined8 uStack_2dc;
  undefined1 local_2c8 [256];
  FabArrayBase *local_1c8;
  FabArrayBase *pFStack_1c0;
  undefined1 local_1b0 [8];
  FabArrayBase *local_1a8 [47];
  
  lVar75 = (long)mglev;
  lVar63 = *(long *)&(this->m_stencil).
                     super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  lVar66 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar65 = lVar75 * 200;
  pdVar1 = (double *)(lVar66 + 0x38 + lVar65);
  dVar82 = *pdVar1;
  dVar7 = pdVar1[1];
  dVar78 = *(double *)(lVar66 + 0x48 + lVar65);
  this_00 = *(FabArray<amrex::IArrayBox> **)
             (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                        super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             + lVar75 * 8);
  local_a50 = CONCAT71((int7)((ulong)lVar65 >> 8),1);
  plVar68 = (long *)(lVar75 * 0x18 +
                    *(long *)&(this->m_sigma).
                              super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                              .
                              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                    );
  local_9d4 = amrlev;
  if (0 < mglev && amrlev == 0) {
    pIVar40 = (this->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a50 = 0;
    if ((pIVar40[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar40[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      local_a50 = CONCAT71((int7)((ulong)(pIVar40 + (uint)mglev) >> 8),
                           (pIVar40 + (uint)mglev)[-1].vect[2] == 2);
    }
    if (((char)local_a50 == '\0') && (*plVar68 == 0)) {
      local_a50 = 0;
      Assert_host("regular_coarsening",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                  ,0x1a9,(char *)0x0);
    }
  }
  if (this->m_use_gauss_seidel != true) {
    local_4a8._0_8_ = (FabArrayBase *)0x1;
    local_4a8._8_8_ = (FabArrayBase *)0x0;
    local_4a8._16_8_ = (FabArrayBase *)0x0;
    pFStack_490 = (FabArrayBase *)0x0;
    pFStack_488 = (FabArrayBase *)0x0;
    local_6a8._0_8_ = &PTR__FabFactory_0080b918;
    MultiFab::MultiFab((MultiFab *)local_1b0,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1
                       ,0,(MFInfo *)local_4a8,(FabFactory<amrex::FArrayBox> *)local_6a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4a8 + 0x10));
    Fapply(this,local_9d4,mglev,(MultiFab *)local_1b0,sol);
    if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
      MFIter::MFIter((MFIter *)local_6a8,(FabArrayBase *)sol,true);
      if (local_688 < iStack_680) {
        do {
          MFIter::tilebox((Box *)&local_a90,(MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_7a8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5a8,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_2c8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8a8,
                     *(FabArray<amrex::FArrayBox> **)(lVar63 + lVar75 * 8),(MFIter *)local_6a8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_9c8,this_00,(MFIter *)local_6a8);
          pFStack_488 = (FabArrayBase *)CONCAT44(local_9c8.begin.y,local_9c8.begin.x);
          uStack_474 = local_9c8._52_8_;
          local_4a8._16_8_ = local_9c8.kstride;
          pFStack_490 = (FabArrayBase *)local_9c8.nstride;
          local_4a8._0_8_ = local_9c8.p;
          local_4a8._8_8_ = local_9c8.jstride;
          uStack_434 = uStack_774;
          pFStack_448 = (FabArrayBase *)local_7a8._32_8_;
          local_458 = (FabArrayBase *)local_7a8._16_8_;
          pFStack_450 = (FabArrayBase *)local_7a8._24_8_;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_7a8._0_8_;
          pFStack_460 = (FabArrayBase *)local_7a8._8_8_;
          pFStack_408 = (FabArrayBase *)CONCAT44(iStack_884,local_888);
          uStack_3f8._4_4_ = iStack_874;
          uStack_3f0 = local_870;
          local_418 = (FabArrayBase *)local_8a8._16_8_;
          pFStack_410 = pFStack_890;
          local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8a8._0_8_;
          tStack_420.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_8a8._8_8_;
          iStack_3b4 = (int)local_2c8._52_8_;
          iStack_3b0 = SUB84(local_2c8._52_8_,4);
          local_3c8 = (int)local_2c8._32_8_;
          iStack_3c4 = SUB84(local_2c8._32_8_,4);
          local_3d8 = (FabArrayBase *)local_2c8._16_8_;
          pFStack_3d0 = (FabArrayBase *)local_2c8._24_8_;
          local_3e8 = (int)local_2c8._0_8_;
          uStack_3e4 = SUB84(local_2c8._0_8_,4);
          pFStack_3e0 = (FabArrayBase *)local_2c8._8_8_;
          iStack_374 = (int)uStack_574;
          iStack_370 = SUB84(uStack_574,4);
          iStack_388 = (int)local_5a8._32_8_;
          iStack_384 = SUB84(local_5a8._32_8_,4);
          local_380 = iStack_580;
          iStack_37c = iStack_57c;
          local_398 = (FabArrayBase *)local_5a8._16_8_;
          pFStack_390 = (FabArrayBase *)local_5a8._24_8_;
          uStack_3a8._0_4_ = (int)local_5a8._0_8_;
          uStack_3a8._4_4_ = SUB84(local_5a8._0_8_,4);
          iStack_3a0 = (int)local_5a8._8_8_;
          uStack_39c = SUB84(local_5a8._8_8_,4);
          LoopConcurrent<amrex::mlndlap_jacobi_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_a90,(anon_class_320_5_f501ae73 *)local_4a8);
          MFIter::operator++((MFIter *)local_6a8);
        } while (local_688 < iStack_680);
      }
    }
    else if (*plVar68 == 0) {
      RVar2 = this->m_const_sigma;
      MFIter::MFIter((MFIter *)local_6a8,(FabArrayBase *)sol,true);
      if (local_688 < iStack_680) {
        do {
          MFIter::tilebox((Box *)&local_9c8,(MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_7a8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5a8,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_2c8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_8a8,this_00,(MFIter *)local_6a8);
          pFStack_488 = (FabArrayBase *)CONCAT44(iStack_884,local_888);
          uStack_474._4_4_ = local_870;
          uStack_474._0_4_ = iStack_874;
          local_4a8._16_8_ = local_8a8._16_8_;
          pFStack_490 = pFStack_890;
          local_4a8._0_8_ = local_8a8._0_8_;
          local_4a8._8_8_ = local_8a8._8_8_;
          uStack_434 = uStack_774;
          pFStack_448 = (FabArrayBase *)local_7a8._32_8_;
          local_458 = (FabArrayBase *)local_7a8._16_8_;
          pFStack_450 = (FabArrayBase *)local_7a8._24_8_;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_7a8._0_8_;
          pFStack_460 = (FabArrayBase *)local_7a8._8_8_;
          uStack_3f8._4_4_ = (int)local_2c8._52_8_;
          uStack_3f0 = SUB84(local_2c8._52_8_,4);
          pFStack_408 = (FabArrayBase *)local_2c8._32_8_;
          local_418 = (FabArrayBase *)local_2c8._16_8_;
          pFStack_410 = (FabArrayBase *)local_2c8._24_8_;
          local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_2c8._0_8_;
          tStack_420.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_2c8._8_8_;
          iStack_3b4 = (int)uStack_574;
          iStack_3b0 = SUB84(uStack_574,4);
          local_3c8 = (int)local_5a8._32_8_;
          iStack_3c4 = SUB84(local_5a8._32_8_,4);
          local_3d8 = (FabArrayBase *)local_5a8._16_8_;
          pFStack_3d0 = (FabArrayBase *)local_5a8._24_8_;
          local_3e8 = (int)local_5a8._0_8_;
          uStack_3e4 = SUB84(local_5a8._0_8_,4);
          pFStack_3e0 = (FabArrayBase *)local_5a8._8_8_;
          iStack_3a0 = SUB84(RVar2,0);
          uStack_39c = (undefined4)((ulong)RVar2 >> 0x20);
          uStack_3a8 = (double *)
                       ((dVar78 * dVar78 + dVar82 * dVar82 + dVar7 * dVar7) * -0.1111111111111111);
          LoopConcurrent<amrex::mlndlap_jacobi_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_9c8,(anon_class_272_6_f7bd19c5 *)local_4a8);
          MFIter::operator++((MFIter *)local_6a8);
        } while (local_688 < iStack_680);
      }
    }
    else if (((mglev < 1) || (this->m_use_harmonic_average == false)) &&
            (this->m_use_mapped != true)) {
      MFIter::MFIter((MFIter *)local_6a8,(FabArrayBase *)sol,true);
      if (local_688 < iStack_680) {
        do {
          MFIter::tilebox((Box *)&local_a90,(MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7a8,(FabArray<amrex::FArrayBox> *)*plVar68,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_5a8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_2c8,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8a8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_9c8,this_00,(MFIter *)local_6a8);
          pFStack_488 = (FabArrayBase *)CONCAT44(local_9c8.begin.y,local_9c8.begin.x);
          uStack_474 = local_9c8._52_8_;
          local_4a8._16_8_ = local_9c8.kstride;
          pFStack_490 = (FabArrayBase *)local_9c8.nstride;
          local_4a8._0_8_ = local_9c8.p;
          local_4a8._8_8_ = local_9c8.jstride;
          uStack_434 = uStack_574;
          pFStack_448 = (FabArrayBase *)local_5a8._32_8_;
          local_458 = (FabArrayBase *)local_5a8._16_8_;
          pFStack_450 = (FabArrayBase *)local_5a8._24_8_;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_5a8._0_8_;
          pFStack_460 = (FabArrayBase *)local_5a8._8_8_;
          pFStack_408 = (FabArrayBase *)CONCAT44(iStack_884,local_888);
          uStack_3f8._4_4_ = iStack_874;
          uStack_3f0 = local_870;
          local_418 = (FabArrayBase *)local_8a8._16_8_;
          pFStack_410 = pFStack_890;
          local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8a8._0_8_;
          tStack_420.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_8a8._8_8_;
          iStack_3b4 = (int)local_2c8._52_8_;
          iStack_3b0 = SUB84(local_2c8._52_8_,4);
          local_3c8 = (int)local_2c8._32_8_;
          iStack_3c4 = SUB84(local_2c8._32_8_,4);
          local_3d8 = (FabArrayBase *)local_2c8._16_8_;
          pFStack_3d0 = (FabArrayBase *)local_2c8._24_8_;
          local_3e8 = (int)local_2c8._0_8_;
          uStack_3e4 = SUB84(local_2c8._0_8_,4);
          pFStack_3e0 = (FabArrayBase *)local_2c8._8_8_;
          iStack_370 = iStack_778;
          iStack_36c = (int)uStack_774;
          iStack_368 = SUB84(uStack_774,4);
          local_380 = (int)local_7a8._32_8_;
          iStack_37c = SUB84(local_7a8._32_8_,4);
          iStack_374 = iStack_77c;
          pFStack_390 = (FabArrayBase *)local_7a8._16_8_;
          iStack_388 = (int)local_7a8._24_8_;
          iStack_384 = SUB84(local_7a8._24_8_,4);
          iStack_3a0 = (int)local_7a8._0_8_;
          uStack_39c = SUB84(local_7a8._0_8_,4);
          local_398 = (FabArrayBase *)local_7a8._8_8_;
          uStack_3a8 = (double *)
                       ((dVar78 * dVar78 + dVar82 * dVar82 + dVar7 * dVar7) * -0.1111111111111111);
          LoopConcurrent<amrex::mlndlap_jacobi_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_a90,(anon_class_328_6_f7bd19c5 *)local_4a8);
          MFIter::operator++((MFIter *)local_6a8);
        } while (local_688 < iStack_680);
      }
    }
    else {
      MFIter::MFIter((MFIter *)local_6a8,(FabArrayBase *)sol,true);
      if (local_688 < iStack_680) {
        do {
          MFIter::tilebox((Box *)&local_8e8,(MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7a8,(FabArray<amrex::FArrayBox> *)*plVar68,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5a8,(FabArray<amrex::FArrayBox> *)plVar68[1],
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_2c8,(FabArray<amrex::FArrayBox> *)plVar68[2],
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_8a8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_9c8,(FabArray<amrex::FArrayBox> *)local_1b0,(MFIter *)local_6a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_a90,&rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_6a8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_938,this_00,(MFIter *)local_6a8);
          pFStack_488 = (FabArrayBase *)CONCAT44(local_938.begin.y,local_938.begin.x);
          uStack_474 = local_938._52_8_;
          local_4a8._16_8_ = local_938.kstride;
          pFStack_490 = (FabArrayBase *)local_938.nstride;
          local_4a8._0_8_ = local_938.p;
          local_4a8._8_8_ = local_938.jstride;
          pFStack_448 = (FabArrayBase *)CONCAT44(iStack_884,local_888);
          uStack_434._4_4_ = local_870;
          uStack_434._0_4_ = iStack_874;
          local_458 = (FabArrayBase *)local_8a8._16_8_;
          pFStack_450 = pFStack_890;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8a8._0_8_;
          pFStack_460 = (FabArrayBase *)local_8a8._8_8_;
          pFStack_408 = (FabArrayBase *)CONCAT44(local_a90.begin.y,local_a90.begin.x);
          uStack_3f8._4_4_ = local_a90.end.z;
          uStack_3f0 = local_a90.ncomp;
          local_418 = (FabArrayBase *)local_a90.kstride;
          pFStack_410 = (FabArrayBase *)local_a90.nstride;
          local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_a90.p;
          tStack_420.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_a90.jstride;
          iStack_3b4 = local_9c8.end.z;
          iStack_3b0 = local_9c8.ncomp;
          local_3c8 = local_9c8.begin.x;
          iStack_3c4 = local_9c8.begin.y;
          local_3d8 = (FabArrayBase *)local_9c8.kstride;
          pFStack_3d0 = (FabArrayBase *)local_9c8.nstride;
          local_3e8 = (int)local_9c8.p;
          uStack_3e4 = (undefined4)((ulong)local_9c8.p >> 0x20);
          pFStack_3e0 = (FabArrayBase *)local_9c8.jstride;
          iStack_370 = iStack_778;
          iStack_36c = (int)uStack_774;
          iStack_368 = SUB84(uStack_774,4);
          local_380 = (int)local_7a8._32_8_;
          iStack_37c = SUB84(local_7a8._32_8_,4);
          iStack_374 = iStack_77c;
          pFStack_390 = (FabArrayBase *)local_7a8._16_8_;
          iStack_388 = (int)local_7a8._24_8_;
          iStack_384 = SUB84(local_7a8._24_8_,4);
          iStack_3a0 = (int)local_7a8._0_8_;
          uStack_39c = SUB84(local_7a8._0_8_,4);
          local_398 = (FabArrayBase *)local_7a8._8_8_;
          local_324 = (int)uStack_574;
          iStack_320 = SUB84(uStack_574,4);
          pFStack_338 = (FabArrayBase *)local_5a8._32_8_;
          pFStack_348 = (FabArrayBase *)local_5a8._16_8_;
          local_340 = (FabArrayBase *)local_5a8._24_8_;
          iStack_358 = (int)local_5a8._0_8_;
          uStack_354 = SUB84(local_5a8._0_8_,4);
          local_350 = (FabArrayBase *)local_5a8._8_8_;
          uStack_2dc = local_2c8._52_8_;
          pFStack_2f0 = (FabArrayBase *)local_2c8._32_8_;
          local_300 = (FabArrayBase *)local_2c8._16_8_;
          pFStack_2f8 = (FabArrayBase *)local_2c8._24_8_;
          local_310 = (FabArrayBase *)local_2c8._0_8_;
          pFStack_308 = (FabArrayBase *)local_2c8._8_8_;
          uStack_3a8 = (double *)(dVar82 * -0.1111111111111111 * dVar82);
          uStack_360 = dVar7 * -0.1111111111111111 * dVar7;
          dStack_318 = dVar78 * -0.1111111111111111 * dVar78;
          LoopConcurrent<amrex::mlndlap_jacobi_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_8e8,(anon_class_472_10_2a1b4a53 *)local_4a8);
          MFIter::operator++((MFIter *)local_6a8);
        } while (local_688 < iStack_680);
      }
    }
    MFIter::~MFIter((MFIter *)local_6a8);
    MultiFab::~MultiFab((MultiFab *)local_1b0);
    return;
  }
  local_94c = mglev;
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
    if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
      do {
        BATransformer::operator()
                  ((Box *)local_8a8,&(local_1a8[0]->boxarray).m_bat,
                   (Box *)((long)*(int *)(*(long *)local_1a8[6] + (long)(int)local_1a8[3]._0_4_ * 4)
                           * 0x1c + *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_6a8,&sol->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1b0);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_7a8,&rhs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1b0);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_5a8,
                   *(FabArray<amrex::FArrayBox> **)(lVar63 + lVar75 * 8),(MFIter *)local_1b0);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)local_2c8,this_00,(MFIter *)local_1b0);
        if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
          iVar71 = 0;
          do {
            uStack_474 = local_2c8._52_8_;
            pFStack_488 = (FabArrayBase *)local_2c8._32_8_;
            local_4a8._16_8_ = local_2c8._16_8_;
            pFStack_490 = (FabArrayBase *)local_2c8._24_8_;
            local_4a8._0_8_ = local_2c8._0_8_;
            local_4a8._8_8_ = local_2c8._8_8_;
            pFStack_448 = (FabArrayBase *)CONCAT44(iStack_684,local_688);
            uStack_434 = uStack_674;
            local_458 = (FabArrayBase *)local_6a8._16_8_;
            pFStack_450 = pFStack_690;
            local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_6a8._0_8_;
            pFStack_460 = (FabArrayBase *)local_6a8._8_8_;
            uStack_3f8._0_4_ = iStack_578;
            uStack_3f8._4_4_ = (int)uStack_574;
            uStack_3f0 = SUB84(uStack_574,4);
            pFStack_408 = (FabArrayBase *)local_5a8._32_8_;
            iStack_400 = iStack_580;
            local_3fc = iStack_57c;
            local_418 = (FabArrayBase *)local_5a8._16_8_;
            pFStack_410 = (FabArrayBase *)local_5a8._24_8_;
            local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_5a8._0_8_;
            tStack_420.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                   )local_5a8._8_8_;
            iStack_3b8 = iStack_778;
            iStack_3b4 = (int)uStack_774;
            iStack_3b0 = SUB84(uStack_774,4);
            local_3c8 = (int)local_7a8._32_8_;
            iStack_3c4 = SUB84(local_7a8._32_8_,4);
            iStack_3c0 = iStack_780;
            iStack_3bc = iStack_77c;
            local_3d8 = (FabArrayBase *)local_7a8._16_8_;
            pFStack_3d0 = (FabArrayBase *)local_7a8._24_8_;
            local_3e8 = (int)local_7a8._0_8_;
            uStack_3e4 = SUB84(local_7a8._0_8_,4);
            pFStack_3e0 = (FabArrayBase *)local_7a8._8_8_;
            LoopConcurrent<amrex::mlndlap_gauss_seidel_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                      ((Box *)local_8a8,(anon_class_256_4_a2b17762 *)local_4a8);
            iVar71 = iVar71 + 1;
          } while (iVar71 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
        }
        MFIter::operator++((MFIter *)local_1b0);
      } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
    }
    MFIter::~MFIter((MFIter *)local_1b0);
  }
  else {
    if (*plVar68 == 0) {
      RVar2 = this->m_const_sigma;
      MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
      if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
        dVar78 = dVar78 * 0.027777777777777776 * dVar78;
        dVar82 = dVar82 * 0.027777777777777776 * dVar82;
        dVar7 = dVar7 * 0.027777777777777776 * dVar7;
        dVar79 = dVar78 + dVar78;
        pFStack_970 = (FabArrayBase *)(((dVar82 + dVar82) - dVar7) + dVar79);
        local_978 = (FabArrayBase *)(((dVar7 + dVar7) - dVar82) + dVar79);
        dVar83 = dVar7 + dVar7;
        dVar41 = (dVar82 * -2.0 + dVar7 * 4.0) - dVar79;
        local_988._8_4_ = SUB84(dVar41,0);
        local_988._0_8_ = (dVar82 * 4.0 + -dVar83) - dVar79;
        local_988._12_4_ = (int)((ulong)dVar41 >> 0x20);
        do {
          BATransformer::operator()
                    ((Box *)local_2c8,&(local_1a8[0]->boxarray).m_bat,
                     (Box *)((long)*(int *)(*(long *)local_1a8[6] +
                                           (long)(int)local_1a8[3]._0_4_ * 4) * 0x1c +
                            *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_6a8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7a8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_5a8,this_00,(MFIter *)local_1b0);
          if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
            iVar71 = 0;
            do {
              uStack_474 = uStack_574;
              pFStack_488 = (FabArrayBase *)local_5a8._32_8_;
              local_4a8._16_8_ = local_5a8._16_8_;
              pFStack_490 = (FabArrayBase *)local_5a8._24_8_;
              local_4a8._0_8_ = local_5a8._0_8_;
              local_4a8._8_8_ = local_5a8._8_8_;
              pFStack_448 = (FabArrayBase *)CONCAT44(iStack_684,local_688);
              uStack_434 = uStack_674;
              local_458 = (FabArrayBase *)local_6a8._16_8_;
              pFStack_450 = pFStack_690;
              local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_6a8._0_8_;
              pFStack_460 = (FabArrayBase *)local_6a8._8_8_;
              tStack_420.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )local_978;
              local_418 = pFStack_970;
              iStack_400 = (int)local_988._8_8_;
              local_3fc = (int)((ulong)local_988._8_8_ >> 0x20);
              iStack_3c0 = iStack_778;
              iStack_3bc = (int)uStack_774;
              iStack_3b8 = SUB84(uStack_774,4);
              pFStack_3d0 = (FabArrayBase *)local_7a8._32_8_;
              local_3c8 = iStack_780;
              iStack_3c4 = iStack_77c;
              pFStack_3e0 = (FabArrayBase *)local_7a8._16_8_;
              local_3d8 = (FabArrayBase *)local_7a8._24_8_;
              uStack_3f0 = (uint)local_7a8._0_8_;
              iStack_3ec = SUB84(local_7a8._0_8_,4);
              local_3e8 = (int)local_7a8._8_8_;
              uStack_3e4 = SUB84(local_7a8._8_8_,4);
              iStack_3b0 = SUB84(RVar2,0);
              iStack_3ac = (int)((ulong)RVar2 >> 0x20);
              local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (FabArrayBase *)(dVar82 + dVar7 + dVar78);
              pFStack_410 = (FabArrayBase *)((dVar82 + dVar82 + dVar83) - dVar78);
              pFStack_408 = (FabArrayBase *)local_988._0_8_;
              uStack_3f8 = dVar78 * 4.0 + (dVar82 * -2.0 - dVar83);
              Loop<amrex::mlndlap_gauss_seidel_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)local_2c8,(anon_class_256_11_43b85e95 *)local_4a8);
              iVar71 = iVar71 + 1;
            } while (iVar71 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
      }
    }
    else {
      if (((mglev < 1) || (this->m_use_harmonic_average == false)) && (this->m_use_mapped != true))
      {
        MFIter::MFIter((MFIter *)local_8a8,(FabArrayBase *)sol,'\0');
        if (local_888 < iStack_880) {
          dVar83 = dVar78 * 0.027777777777777776 * dVar78;
          dVar41 = dVar82 * 0.027777777777777776 * dVar82;
          local_988._8_8_ = dVar7 * 0.027777777777777776 * dVar7;
          pFVar84 = (FabArrayBase *)(dVar41 + (double)local_988._8_8_ + dVar83);
          dStack_840 = dVar83 + dVar83;
          local_7f8 = (FabArrayBase *)(((dVar41 + dVar41) - (double)local_988._8_8_) + dStack_840);
          pFStack_7f0 = (FabArrayBase *)
                        ((((double)local_988._8_8_ + (double)local_988._8_8_) - dVar41) + dStack_840
                        );
          dVar79 = (double)local_988._8_8_ + (double)local_988._8_8_;
          local_988._0_8_ = (dVar41 + dVar41 + dVar79) - dVar83;
          local_848 = (dVar41 * 4.0 + -dVar79) - dStack_840;
          dStack_840 = (dVar41 * -2.0 + (double)local_988._8_8_ * 4.0) - dStack_840;
          auVar81._8_8_ = -(ulong)(0.0 < dVar7);
          auVar81._0_8_ = -(ulong)(dVar78 < dVar82);
          auVar42._8_4_ = (int)-(ulong)(0.0 < dVar7);
          auVar42._0_8_ = -(ulong)(dVar78 < dVar7);
          auVar42._12_4_ = (int)(-(ulong)(0.0 < dVar7) >> 0x20);
          local_7e0 = SUB168(auVar81 | auVar42,0);
          local_940 = -(uint)(dVar7 < dVar78 || dVar7 < dVar82);
          local_948 = 1;
          if ((local_940 & 1) != 0) {
            local_948 = SUB164(auVar81 | auVar42,0) | 2;
          }
          local_978 = (FabArrayBase *)(dVar83 * 4.0 + (dVar41 * -2.0 - dVar79));
          local_944 = -(uint)(dVar82 < dVar78 || dVar82 < dVar7);
          if ((local_944 & 1) == 0) {
            local_948 = 0;
          }
          local_958 = (double)pFVar84 * -4.0;
          local_808._8_4_ = (int)pFStack_7f0;
          local_808._0_8_ = pFStack_7f0;
          local_808._12_4_ = (int)((ulong)pFStack_7f0 >> 0x20);
          local_818 = dStack_840;
          dStack_810 = dStack_840;
          local_1c8 = pFStack_7f0;
          pFStack_1c0 = local_7f8;
          do {
            BATransformer::operator()
                      (&local_834,(BATransformer *)(local_8a8._8_8_ + 8),
                       (Box *)((long)*(int *)(*(long *)CONCAT44(uStack_86c,local_870) +
                                             (long)local_888 * 4) * 0x1c +
                              *(long *)&(((((BoxArray *)(local_8a8._8_8_ + 8))->m_ref).
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data));
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_9c8,(FabArray<amrex::FArrayBox> *)*plVar68,(MFIter *)local_8a8);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_a90,&sol->super_FabArray<amrex::FArrayBox>,
                       (MFIter *)local_8a8);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_938,&rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_8a8);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      (&local_8e8,this_00,(MFIter *)local_8a8);
            iVar71 = (this->super_MLNodeLinOp).m_smooth_num_sweeps;
            if ((char)local_a50 == '\0') {
              if (0 < iVar71) {
                local_9d0 = 0;
                do {
                  iVar50 = local_834.bigend.vect[2];
                  iVar49 = local_834.bigend.vect[1];
                  iVar48 = local_834.bigend.vect[0];
                  iVar52 = local_834.smallend.vect[2];
                  iVar71 = local_834.smallend.vect[1];
                  iVar47 = local_834.smallend.vect[0];
                  local_b10 = (FabArrayBase *)(ulong)(uint)local_834.smallend.vect[2];
                  uVar60 = (local_834.bigend.vect[2] - local_834.smallend.vect[2]) + 1;
                  uVar51 = uVar60;
                  if ((local_7e0 & 1) != 0) {
                    uVar51 = 0x21;
                  }
                  uVar62 = (local_834.bigend.vect[1] - local_834.smallend.vect[1]) + 1;
                  if ((local_940 & 1) == 0) {
                    uVar51 = uVar62;
                  }
                  uVar73 = local_834.bigend.vect[0] - local_834.smallend.vect[0];
                  uVar43 = uVar73 + 1;
                  if ((local_944 & 1) != 0) {
                    uVar43 = uVar51;
                  }
                  uVar57 = (ulong)uVar43;
                  if (0x20 < (int)uVar43) {
                    Abort_host(
                              "mlndlap_gauss_seidel_with_line_solve_aa is hard-wired to be no longer than 32"
                              );
                  }
                  if (local_948 == 2) {
                    if (iVar71 <= iVar49) {
                      local_b50._M_head_impl = (FabArrayBase *)(long)iVar52;
                      local_a48 = (FabArrayBase *)(ulong)(uVar43 - 2);
                      local_af0._M_head_impl._0_4_ = iVar50 + 1;
                      pFVar59 = (FabArrayBase *)(uVar57 * 8 + -8);
                      local_960 = (FabArrayBase *)((long)&local_a48->_vptr_FabArrayBase + 1);
                      local_a40 = pFVar59;
                      do {
                        if (iVar47 <= iVar48) {
                          local_a38 = CONCAT44(local_a38._4_4_,iVar71 + -1);
                          uVar51 = iVar47;
                          do {
                            lVar63 = (long)(int)uVar51;
                            if (iVar52 <= iVar50) {
                              lVar72 = (long)(int)((uVar51 - 1) - local_9c8.begin.x);
                              lVar54 = ((int)local_a38 - local_9c8.begin.y) * local_9c8.jstride;
                              lVar65 = (long)(int)(uVar51 - local_9c8.begin.x);
                              lVar74 = (iVar71 - local_9c8.begin.y) * local_9c8.jstride;
                              local_9e0 = (_func_int ***)local_9c8.p + lVar74 + lVar65;
                              lVar66 = (long)(int)((uVar51 - 1) - local_a90.begin.x);
                              lVar53 = ((int)local_a38 - local_a90.begin.y) * local_a90.jstride;
                              local_9e8 = (_func_int ***)local_a90.p + lVar53 + lVar66;
                              lVar75 = (long)(int)((uVar51 - local_a90.begin.x) + 1);
                              lVar64 = ((iVar71 + 1) - local_a90.begin.y) * local_a90.jstride;
                              lVar69 = (iVar71 - local_a90.begin.y) * local_a90.jstride;
                              local_a08 = (FabArrayBase *)
                                          ((_func_int ***)local_a90.p + lVar64 + lVar66);
                              lVar70 = (long)(int)(uVar51 - local_a90.begin.x);
                              local_a18 = (_func_int ***)local_a90.p + lVar53 + lVar70;
                              local_9f0 = (_func_int ***)(long)local_8e8.begin.z;
                              local_a00 = (_func_int ***)(long)local_9c8.begin.z;
                              local_a10 = (FabArrayBase *)local_9c8.kstride;
                              local_a20 = (long)local_938.begin.z;
                              local_a28 = (FabArrayBase *)local_938.kstride;
                              local_9f8 = (FabArrayBase *)local_8e8.kstride;
                              pFVar59 = local_b50._M_head_impl;
                              do {
                                iVar61 = (int)pFVar59;
                                if (*(int *)((long)local_8e8.p +
                                            ((long)pFVar59 - (long)local_9f0) * local_8e8.kstride *
                                            4 + (lVar63 - local_8e8.begin.x) * 4 +
                                                ((long)iVar71 - (long)local_8e8.begin.y) *
                                                local_8e8.jstride * 4) == 0) {
                                  lVar56 = ((long)pFVar59 + (-1 - (long)local_a00)) *
                                           local_9c8.kstride;
                                  pp_Var3 = ((_func_int ***)local_9c8.p)[lVar54 + lVar72 + lVar56];
                                  pp_Var4 = ((_func_int ***)local_9c8.p)[lVar54 + lVar65 + lVar56];
                                  dVar78 = (double)pp_Var3 + (double)pp_Var4;
                                  pp_Var5 = ((_func_int ***)local_9c8.p)[lVar74 + lVar72 + lVar56];
                                  pp_Var6 = local_9e0[lVar56];
                                  dVar82 = dVar78 + (double)pp_Var5 + (double)pp_Var6;
                                  lVar56 = ((long)pFVar59 - (long)local_a00) * local_9c8.kstride;
                                  pp_Var8 = ((_func_int ***)local_9c8.p)[lVar54 + lVar72 + lVar56];
                                  pp_Var9 = ((_func_int ***)local_9c8.p)[lVar54 + lVar65 + lVar56];
                                  pp_Var10 = ((_func_int ***)local_9c8.p)[lVar74 + lVar72 + lVar56];
                                  pp_Var11 = local_9e0[lVar56];
                                  lVar56 = ((long)pFVar59 + (-1 - (long)local_a90.begin.z)) *
                                           local_a90.kstride;
                                  pp_Var12 = ((_func_int ***)local_a90.p)[lVar53 + lVar75 + lVar56];
                                  pp_Var13 = local_9e8[lVar56];
                                  pp_Var14 = (&local_a08->_vptr_FabArrayBase)[lVar56];
                                  pp_Var17 = ((_func_int ***)local_a90.p)[lVar64 + lVar75 + lVar56];
                                  lVar67 = ((iVar61 + 1) - local_a90.begin.z) * local_a90.kstride;
                                  pp_Var18 = local_9e8[lVar67];
                                  pp_Var19 = ((_func_int ***)local_a90.p)[lVar53 + lVar75 + lVar67];
                                  pp_Var20 = (&local_a08->_vptr_FabArrayBase)[lVar67];
                                  pp_Var21 = ((_func_int ***)local_a90.p)[lVar64 + lVar75 + lVar67];
                                  pp_Var22 = ((_func_int ***)local_a90.p)[lVar64 + lVar70 + lVar56];
                                  pp_Var24 = local_a18[lVar56];
                                  pp_Var25 = local_a18[lVar67];
                                  pp_Var26 = ((_func_int ***)local_a90.p)[lVar69 + lVar66 + lVar56];
                                  pp_Var28 = ((_func_int ***)local_a90.p)[lVar64 + lVar70 + lVar67];
                                  pp_Var29 = ((_func_int ***)local_a90.p)[lVar69 + lVar75 + lVar56];
                                  pp_Var30 = ((_func_int ***)local_a90.p)[lVar69 + lVar66 + lVar67];
                                  pp_Var31 = ((_func_int ***)local_a90.p)[lVar69 + lVar75 + lVar67];
                                  lVar56 = ((long)pFVar59 - (long)local_a90.begin.z) *
                                           local_a90.kstride;
                                  pp_Var32 = ((_func_int ***)local_a90.p)[lVar53 + lVar75 + lVar56];
                                  pp_Var33 = local_9e8[lVar56];
                                  pp_Var34 = (&local_a08->_vptr_FabArrayBase)[lVar56];
                                  pp_Var35 = ((_func_int ***)local_a90.p)[lVar64 + lVar75 + lVar56];
                                  pp_Var36 = ((_func_int ***)local_a90.p)[lVar69 + lVar75 + lVar56];
                                  pp_Var37 = ((_func_int ***)local_a90.p)[lVar69 + lVar66 + lVar56];
                                  pp_Var38 = ((_func_int ***)local_a90.p)[lVar64 + lVar70 + lVar56];
                                  pp_Var39 = local_a18[lVar56];
                                  lVar56 = (long)pFVar59 - (long)local_b50._M_head_impl;
                                  *(double *)(local_4a8 + lVar56 * 8) = dVar82 * (double)local_978;
                                  local_1a8[lVar56 + -1] =
                                       (FabArrayBase *)
                                       ((dVar82 + (double)pp_Var8 + (double)pp_Var9 +
                                         (double)pp_Var10 + (double)pp_Var11) * local_958);
                                  *(double *)(local_6a8 + lVar56 * 8) =
                                       ((double)pp_Var8 + (double)pp_Var9 + (double)pp_Var10 +
                                       (double)pp_Var11) * (double)local_978;
                                  *(undefined8 *)(local_7a8 + lVar56 * 8) = 0;
                                  *(double *)(local_5a8 + lVar56 * 8) =
                                       *(double *)
                                        ((long)local_938.p +
                                        ((long)pFVar59 - local_a20) * local_938.kstride * 8 +
                                        (lVar63 - local_938.begin.x) * 8 +
                                        ((long)iVar71 - (long)local_938.begin.y) * local_938.jstride
                                        * 8) - (((dVar78 + (double)pp_Var8 + (double)pp_Var9) *
                                                 (double)pp_Var39 +
                                                ((double)pp_Var5 + (double)pp_Var6 +
                                                 (double)pp_Var10 + (double)pp_Var11) *
                                                (double)pp_Var38) * local_818 +
                                               (((double)pp_Var3 + (double)pp_Var5 + (double)pp_Var8
                                                + (double)pp_Var10) * (double)pp_Var37 +
                                               ((double)pp_Var4 + (double)pp_Var6 + (double)pp_Var9
                                               + (double)pp_Var11) * (double)pp_Var36) * local_848 +
                                               (((double)pp_Var6 + (double)pp_Var11) *
                                                (double)pp_Var35 +
                                               ((double)pp_Var5 + (double)pp_Var10) *
                                               (double)pp_Var34 +
                                               ((double)pp_Var3 + (double)pp_Var8) *
                                               (double)pp_Var33 +
                                               ((double)pp_Var4 + (double)pp_Var9) *
                                               (double)pp_Var32) * (double)local_988._0_8_ +
                                               (((double)pp_Var9 + (double)pp_Var11) *
                                                (double)pp_Var31 +
                                               ((double)pp_Var8 + (double)pp_Var10) *
                                               (double)pp_Var30 +
                                               (double)pp_Var26 *
                                               ((double)pp_Var3 + (double)pp_Var5) +
                                               (double)pp_Var29 *
                                               ((double)pp_Var4 + (double)pp_Var6)) *
                                               (double)local_7f8 +
                                               ((double)pp_Var21 * (double)pp_Var11 +
                                               (double)pp_Var20 * (double)pp_Var10 +
                                               (double)pp_Var19 * (double)pp_Var9 +
                                               (double)pp_Var18 * (double)pp_Var8 +
                                               (double)pp_Var17 * (double)pp_Var6 +
                                               (double)pp_Var14 * (double)pp_Var5 +
                                               (double)pp_Var13 * (double)pp_Var3 +
                                               (double)pp_Var12 * (double)pp_Var4) * (double)pFVar84
                                               + (((double)pp_Var10 + (double)pp_Var11) *
                                                  (double)pp_Var28 +
                                                 (double)pp_Var25 *
                                                 ((double)pp_Var8 + (double)pp_Var9) +
                                                 (double)pp_Var24 * dVar78 +
                                                 (double)pp_Var22 *
                                                 ((double)pp_Var5 + (double)pp_Var6)) *
                                                 (double)local_808._0_8_);
                                }
                                else {
                                  lVar56 = (long)pFVar59 - (long)local_b50._M_head_impl;
                                  *(undefined8 *)(local_4a8 + lVar56 * 8) = 0;
                                  local_1a8[lVar56 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                  *(undefined8 *)(local_6a8 + lVar56 * 8) = 0;
                                  *(undefined8 *)(local_7a8 + lVar56 * 8) = 0;
                                  *(undefined8 *)(local_5a8 + lVar56 * 8) = 0;
                                }
                                pFVar59 = (FabArrayBase *)((long)&pFVar59->_vptr_FabArrayBase + 1);
                              } while (iVar61 + 1 != iVar50 + 1);
                              local_b28._M_head_impl = (FabArrayBase *)local_1b0;
                              local_af8 = (FabArrayBase *)local_5a8._0_8_;
                              pFVar59 = local_a40;
                              local_a30 = (FabArrayBase *)(ulong)uVar51;
                            }
                            local_b78 = (FabArrayBase *)((double)local_af8 / local_b28._M_head_impl)
                            ;
                            local_7a8._0_8_ = local_b78;
                            if (1 < (int)uVar43) {
                              lVar66 = 0;
                              _Var77._M_head_impl = local_b28._M_head_impl;
                              do {
                                dVar78 = *(double *)(local_6a8 + lVar66);
                                *(double *)(local_2c8 + lVar66 + 8) =
                                     dVar78 / (double)_Var77._M_head_impl;
                                dVar82 = *(double *)(local_4a8 + lVar66 + 8);
                                _Var77._M_head_impl =
                                     (FabArrayBase *)
                                     (*(double *)((long)local_1a8 + lVar66) -
                                     (dVar78 / (double)_Var77._M_head_impl) * dVar82);
                                if (((double)_Var77._M_head_impl == 0.0) &&
                                   (!NAN((double)_Var77._M_head_impl))) {
                                  Abort_host(">>>TRIDIAG FAILED");
                                }
                                local_b78 = (FabArrayBase *)
                                            (((double)local_b78 * -dVar82 +
                                             *(double *)(local_5a8 + lVar66 + 8)) /
                                            (double)_Var77._M_head_impl);
                                *(FabArrayBase **)(local_7a8 + lVar66 + 8) = local_b78;
                                lVar66 = lVar66 + 8;
                              } while (pFVar59 != (FabArrayBase *)lVar66);
                              if (1 < (int)uVar43) {
                                dVar78 = *(double *)(local_7a8 + (long)local_a48 * 8 + 8);
                                pFVar55 = local_960;
                                do {
                                  dVar78 = (&local_7b0)[(long)pFVar55] -
                                           dVar78 * *(double *)(local_2c8 + (long)pFVar55 * 8);
                                  (&local_7b0)[(long)pFVar55] = dVar78;
                                  uVar46 = pFVar55 + 0xffffffffffffffff;
                                  bVar76 = 0 < (long)pFVar55;
                                  pFVar55 = (FabArrayBase *)(uVar46 + 0xef);
                                } while ((FabArrayBase *)(uVar46 + 0xef) != (FabArrayBase *)0x0 &&
                                         bVar76);
                              }
                            }
                            if (iVar52 <= iVar50) {
                              puVar58 = (undefined8 *)
                                        (((long)local_b50._M_head_impl - (long)local_a90.begin.z) *
                                         local_a90.kstride * 8 +
                                         ((long)iVar71 - (long)local_a90.begin.y) *
                                         local_a90.jstride * 8 + lVar63 * 8 +
                                         (long)local_a90.begin.x * -8 + (long)local_a90.p);
                              lVar63 = 0;
                              do {
                                *puVar58 = *(undefined8 *)(local_7a8 + lVar63 * 8);
                                lVar63 = lVar63 + 1;
                                puVar58 = puVar58 + local_a90.kstride;
                              } while (uVar60 != (uint)lVar63);
                            }
                            bVar76 = uVar51 != iVar48;
                            uVar51 = uVar51 + 1;
                          } while (bVar76);
                        }
                        iVar71 = iVar71 + 1;
                      } while (iVar71 != iVar49 + 1);
                    }
                  }
                  else if (local_948 == 1) {
                    if (iVar52 <= iVar50) {
                      lVar63 = (long)iVar71;
                      local_7d0 = (ulong)(uVar43 - 2);
                      local_b50._M_head_impl = (FabArrayBase *)(uVar57 * 8 + -8);
                      local_7d8 = local_7d0 + 1;
                      uVar57 = (ulong)uVar62;
                      local_8f8 = uVar57;
                      do {
                        iVar52 = (int)local_b10;
                        if (iVar48 < iVar47) {
                          uVar60 = iVar52 + 1;
                        }
                        else {
                          local_93c = iVar52 + -1;
                          local_9cc = iVar52 + 1;
                          uVar51 = iVar47;
                          do {
                            local_8f0 = (long)(int)uVar51;
                            if (iVar71 <= iVar49) {
                              local_9f0 = (_func_int ***)(long)local_8e8.begin.y;
                              local_9f8 = (FabArrayBase *)
                                          ((local_93c - local_9c8.begin.z) * local_9c8.kstride);
                              local_a00 = (_func_int ***)
                                          ((iVar52 - local_9c8.begin.z) * local_9c8.kstride);
                              local_a38 = (local_93c - local_a90.begin.z) * local_a90.kstride;
                              local_7b0 = (double)((int)(local_9cc - local_a90.begin.z) *
                                                  local_a90.kstride);
                              local_a28 = (FabArrayBase *)
                                          ((iVar52 - local_a90.begin.z) * local_a90.kstride);
                              local_a08 = (FabArrayBase *)local_9c8.p;
                              local_a10 = (FabArrayBase *)
                                          (long)(int)((uVar51 - 1) - local_9c8.begin.x);
                              local_a18 = (_func_int ***)(long)(int)(uVar51 - local_9c8.begin.x);
                              local_a20 = (long)(int)((uVar51 - 1) - local_a90.begin.x);
                              lVar65 = (long)(int)((uVar51 - local_a90.begin.x) + 1);
                              lVar75 = (long)(int)(uVar51 - local_a90.begin.x);
                              local_a30 = (FabArrayBase *)local_9c8.jstride;
                              local_a40 = (FabArrayBase *)local_a90.p;
                              local_a48 = (FabArrayBase *)local_a90.jstride;
                              local_960 = (FabArrayBase *)(long)local_a90.begin.y;
                              local_7b8 = (long)local_938.begin.y;
                              local_7c0 = (FabArrayBase *)local_938.jstride;
                              lVar66 = lVar63;
                              do {
                                iVar61 = (int)lVar66;
                                if (*(int *)((long)local_8e8.p +
                                            (lVar66 - (long)local_9f0) * local_8e8.jstride * 4 +
                                            ((long)iVar52 - (long)local_8e8.begin.z) *
                                            local_8e8.kstride * 4 +
                                            (local_8f0 - local_8e8.begin.x) * 4) == 0) {
                                  lVar72 = ((lVar66 + -1) - (long)local_9c8.begin.y) *
                                           local_9c8.jstride;
                                  pp_Var3 = ((_func_int ***)local_9c8.p)
                                            [(long)&local_9f8->_vptr_FabArrayBase +
                                             (long)(lVar72 + (long)&local_a10->_vptr_FabArrayBase)];
                                  pp_Var4 = ((_func_int ***)local_9c8.p)
                                            [(long)&local_9f8->_vptr_FabArrayBase +
                                             (long)(lVar72 + (long)local_a18)];
                                  dVar82 = (double)pp_Var3 + (double)pp_Var4;
                                  lVar53 = (lVar66 - local_9c8.begin.y) * local_9c8.jstride;
                                  pp_Var5 = ((_func_int ***)local_9c8.p)
                                            [(long)&local_9f8->_vptr_FabArrayBase +
                                             (long)(lVar53 + (long)&local_a10->_vptr_FabArrayBase)];
                                  pp_Var6 = ((_func_int ***)local_9c8.p)
                                            [(long)&local_9f8->_vptr_FabArrayBase +
                                             (long)(lVar53 + (long)local_a18)];
                                  dVar78 = dVar82 + (double)pp_Var5 + (double)pp_Var6;
                                  pp_Var8 = ((_func_int ***)local_9c8.p)
                                            [(long)((long)local_a00 +
                                                   (long)(lVar72 + (long)&local_a10->
                                                                          _vptr_FabArrayBase))];
                                  local_9e0 = (_func_int ***)
                                              ((_func_int ***)local_9c8.p)
                                              [(long)((long)local_a00 +
                                                     (long)(lVar72 + (long)local_a18))];
                                  pp_Var9 = ((_func_int ***)local_9c8.p)
                                            [(long)((long)local_a00 +
                                                   (long)(lVar53 + (long)&local_a10->
                                                                          _vptr_FabArrayBase))];
                                  pp_Var10 = ((_func_int ***)local_9c8.p)
                                             [(long)((long)local_a00 +
                                                    (long)(lVar53 + (long)local_a18))];
                                  lVar72 = ((lVar66 + -1) - (long)local_960) * local_a90.jstride;
                                  local_af8 = (FabArrayBase *)
                                              ((_func_int ***)local_a90.p + lVar72 + lVar65);
                                  pp_Var11 = (&local_af8->_vptr_FabArrayBase)[local_a38];
                                  pp_Var12 = ((_func_int ***)local_a90.p)
                                             [lVar72 + local_a20 + local_a38];
                                  lVar53 = ((iVar61 + 1) - local_a90.begin.y) * local_a90.jstride;
                                  pp_Var13 = ((_func_int ***)local_a90.p)
                                             [lVar53 + local_a20 + local_a38];
                                  pp_Var14 = ((_func_int ***)local_a90.p)
                                             [lVar53 + lVar65 + local_a38];
                                  pp_Var17 = ((_func_int ***)local_a90.p)
                                             [lVar72 + local_a20 + (long)local_7b0];
                                  pp_Var18 = (&local_af8->_vptr_FabArrayBase)[(long)local_7b0];
                                  pp_Var19 = ((_func_int ***)local_a90.p)
                                             [lVar53 + local_a20 + (long)local_7b0];
                                  pp_Var20 = ((_func_int ***)local_a90.p)
                                             [lVar53 + lVar65 + (long)local_7b0];
                                  pp_Var21 = ((_func_int ***)local_a90.p)
                                             [lVar53 + lVar75 + local_a38];
                                  pp_Var22 = ((_func_int ***)local_a90.p)
                                             [lVar72 + lVar75 + local_a38];
                                  lVar74 = (lVar66 - (long)local_960) * local_a90.jstride;
                                  pp_Var24 = ((_func_int ***)local_a90.p)
                                             [lVar74 + local_a20 + local_a38];
                                  local_9e8 = (_func_int ***)((double)pp_Var3 + (double)pp_Var8);
                                  pp_Var25 = ((_func_int ***)local_a90.p)
                                             [lVar72 + lVar75 + (long)local_7b0];
                                  pp_Var26 = ((_func_int ***)local_a90.p)
                                             [lVar53 + lVar75 + (long)local_7b0];
                                  pp_Var28 = ((_func_int ***)local_a90.p)
                                             [lVar74 + lVar65 + local_a38];
                                  pp_Var29 = ((_func_int ***)local_a90.p)
                                             [lVar74 + local_a20 + (long)local_7b0];
                                  pp_Var30 = ((_func_int ***)local_a90.p)
                                             [lVar74 + lVar65 + (long)local_7b0];
                                  pp_Var31 = (&local_af8->_vptr_FabArrayBase)[(long)local_a28];
                                  pp_Var32 = ((_func_int ***)local_a90.p)
                                             [(long)&local_a28->_vptr_FabArrayBase +
                                              lVar72 + local_a20];
                                  pp_Var33 = ((_func_int ***)local_a90.p)
                                             [(long)&local_a28->_vptr_FabArrayBase +
                                              lVar53 + local_a20];
                                  pp_Var34 = ((_func_int ***)local_a90.p)
                                             [(long)&local_a28->_vptr_FabArrayBase + lVar53 + lVar65
                                             ];
                                  pp_Var35 = ((_func_int ***)local_a90.p)
                                             [(long)&local_a28->_vptr_FabArrayBase + lVar74 + lVar65
                                             ];
                                  pp_Var36 = ((_func_int ***)local_a90.p)
                                             [(long)&local_a28->_vptr_FabArrayBase +
                                              lVar74 + local_a20];
                                  pp_Var37 = ((_func_int ***)local_a90.p)
                                             [lVar74 + lVar75 + (long)local_7b0];
                                  pp_Var38 = ((_func_int ***)local_a90.p)
                                             [lVar74 + lVar75 + local_a38];
                                  lVar72 = lVar66 - lVar63;
                                  *(double *)(local_4a8 + lVar72 * 8) =
                                       (dVar82 + (double)pp_Var8 + (double)local_9e0) * local_818;
                                  local_1a8[lVar72 + -1] =
                                       (FabArrayBase *)
                                       ((dVar78 + (double)pp_Var8 + (double)local_9e0 +
                                         (double)pp_Var9 + (double)pp_Var10) * local_958);
                                  *(double *)(local_6a8 + lVar72 * 8) =
                                       ((double)pp_Var5 + (double)pp_Var6 + (double)pp_Var9 +
                                       (double)pp_Var10) * local_818;
                                  *(undefined8 *)(local_7a8 + lVar72 * 8) = 0;
                                  *(double *)(local_5a8 + lVar72 * 8) =
                                       *(double *)
                                        ((long)local_938.p +
                                        (lVar66 - local_7b8) * local_938.jstride * 8 +
                                        ((long)iVar52 - (long)local_938.begin.z) * local_938.kstride
                                        * 8 + (local_8f0 - local_938.begin.x) * 8) -
                                       ((dVar78 * (double)pp_Var38 +
                                        ((double)pp_Var8 + (double)local_9e0 + (double)pp_Var9 +
                                        (double)pp_Var10) * (double)pp_Var37) * (double)local_978 +
                                       (((double)pp_Var3 + (double)pp_Var5 + (double)pp_Var8 +
                                        (double)pp_Var9) * (double)pp_Var36 +
                                       ((double)pp_Var4 + (double)pp_Var6 + (double)local_9e0 +
                                       (double)pp_Var10) * (double)pp_Var35) * local_848 +
                                       (((double)pp_Var6 + (double)pp_Var10) * (double)pp_Var34 +
                                       ((double)pp_Var5 + (double)pp_Var9) * (double)pp_Var33 +
                                       (double)local_9e8 * (double)pp_Var32 +
                                       ((double)pp_Var4 + (double)local_9e0) * (double)pp_Var31) *
                                       (double)local_988._0_8_ +
                                       (((double)local_9e0 + (double)pp_Var10) * (double)pp_Var30 +
                                       ((double)pp_Var8 + (double)pp_Var9) * (double)pp_Var29 +
                                       (double)pp_Var24 * ((double)pp_Var3 + (double)pp_Var5) +
                                       (double)pp_Var28 * ((double)pp_Var4 + (double)pp_Var6)) *
                                       (double)local_7f8 +
                                       ((double)pp_Var20 * (double)pp_Var10 +
                                       (double)pp_Var19 * (double)pp_Var9 +
                                       (double)pp_Var18 * (double)local_9e0 +
                                       (double)pp_Var17 * (double)pp_Var8 +
                                       (double)pp_Var14 * (double)pp_Var6 +
                                       (double)pp_Var13 * (double)pp_Var5 +
                                       (double)pp_Var12 * (double)pp_Var3 +
                                       (double)pp_Var11 * (double)pp_Var4) * (double)pFVar84 +
                                       (((double)pp_Var9 + (double)pp_Var10) * (double)pp_Var26 +
                                       (double)pp_Var25 * ((double)pp_Var8 + (double)local_9e0) +
                                       (double)pp_Var22 * dVar82 +
                                       (double)pp_Var21 * ((double)pp_Var5 + (double)pp_Var6)) *
                                       (double)local_808._0_8_);
                                }
                                else {
                                  lVar72 = lVar66 - lVar63;
                                  *(undefined8 *)(local_4a8 + lVar72 * 8) = 0;
                                  local_1a8[lVar72 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                  *(undefined8 *)(local_6a8 + lVar72 * 8) = 0;
                                  *(undefined8 *)(local_7a8 + lVar72 * 8) = 0;
                                  *(undefined8 *)(local_5a8 + lVar72 * 8) = 0;
                                }
                                lVar66 = lVar66 + 1;
                              } while (iVar61 + 1 != iVar49 + 1);
                              local_af0._M_head_impl = (FabArrayBase *)local_1b0;
                              local_b28._M_head_impl = (FabArrayBase *)local_5a8._0_8_;
                              uVar57 = local_8f8;
                              local_7c8 = (ulong)uVar51;
                            }
                            local_b78 = (FabArrayBase *)
                                        (local_b28._M_head_impl / local_af0._M_head_impl);
                            local_7a8._0_8_ = local_b78;
                            if (1 < (int)uVar43) {
                              lVar66 = 0;
                              _Var77._M_head_impl = local_af0._M_head_impl;
                              do {
                                dVar78 = *(double *)(local_6a8 + lVar66);
                                *(double *)(local_2c8 + lVar66 + 8) =
                                     dVar78 / (double)_Var77._M_head_impl;
                                dVar82 = *(double *)(local_4a8 + lVar66 + 8);
                                _Var77._M_head_impl =
                                     (FabArrayBase *)
                                     (*(double *)((long)local_1a8 + lVar66) -
                                     (dVar78 / (double)_Var77._M_head_impl) * dVar82);
                                if (((double)_Var77._M_head_impl == 0.0) &&
                                   (!NAN((double)_Var77._M_head_impl))) {
                                  Abort_host(">>>TRIDIAG FAILED");
                                }
                                local_b78 = (FabArrayBase *)
                                            (((double)local_b78 * -dVar82 +
                                             *(double *)(local_5a8 + lVar66 + 8)) /
                                            (double)_Var77._M_head_impl);
                                *(FabArrayBase **)(local_7a8 + lVar66 + 8) = local_b78;
                                lVar66 = lVar66 + 8;
                              } while (local_b50._M_head_impl != (FabArrayBase *)lVar66);
                              uVar57 = local_8f8;
                              if (1 < (int)uVar43) {
                                dVar78 = *(double *)(local_7a8 + local_7d0 * 8 + 8);
                                lVar66 = local_7d8;
                                do {
                                  dVar78 = (&local_7b0)[lVar66] -
                                           dVar78 * *(double *)(local_2c8 + lVar66 * 8);
                                  (&local_7b0)[lVar66] = dVar78;
                                  lVar65 = lVar66 + -1;
                                  bVar76 = 0 < lVar66;
                                  lVar66 = lVar65;
                                } while (lVar65 != 0 && bVar76);
                              }
                            }
                            if (iVar71 <= iVar49) {
                              puVar58 = (undefined8 *)
                                        ((lVar63 - local_a90.begin.y) * local_a90.jstride * 8 +
                                         ((long)iVar52 - (long)local_a90.begin.z) *
                                         local_a90.kstride * 8 + local_8f0 * 8 +
                                         (long)local_a90.begin.x * -8 + (long)local_a90.p);
                              lVar66 = 0;
                              do {
                                *puVar58 = *(undefined8 *)(local_7a8 + lVar66 * 8);
                                lVar66 = lVar66 + 1;
                                puVar58 = puVar58 + local_a90.jstride;
                              } while ((int)uVar57 != (int)lVar66);
                            }
                            bVar76 = uVar51 != iVar48;
                            uVar60 = local_9cc;
                            uVar51 = uVar51 + 1;
                          } while (bVar76);
                        }
                        local_b10 = (FabArrayBase *)(ulong)uVar60;
                      } while (uVar60 != iVar50 + 1U);
                    }
                  }
                  else if (local_948 == 0) {
                    if (iVar71 <= iVar49) {
                      local_af0._M_head_impl = (FabArrayBase *)(long)iVar47;
                      local_a40 = (FabArrayBase *)(ulong)(uVar43 - 2);
                      local_b28._M_head_impl._0_4_ = iVar48 + 1U;
                      local_a38 = (ulong)uVar73 * 8 + 8;
                      pFVar59 = (FabArrayBase *)(uVar57 * 8 + -8);
                      local_a48 = (FabArrayBase *)((long)&local_a40->_vptr_FabArrayBase + 1);
                      local_a30 = pFVar59;
                      do {
                        if (iVar52 <= iVar50) {
                          pFVar55 = local_b10;
                          do {
                            iVar61 = (int)pFVar55;
                            if (iVar47 <= iVar48) {
                              local_9e0 = (_func_int ***)
                                          (((iVar61 + -1) - local_9c8.begin.z) * local_9c8.kstride);
                              local_9e8 = (_func_int ***)local_9c8.p +
                                          ((iVar71 + -1) - local_9c8.begin.y) * local_9c8.jstride;
                              lVar63 = (iVar71 - local_9c8.begin.y) * local_9c8.jstride;
                              local_9f8 = (FabArrayBase *)
                                          ((iVar61 - local_9c8.begin.z) * local_9c8.kstride);
                              lVar66 = ((iVar71 + -1) - local_a90.begin.y) * local_a90.jstride;
                              lVar65 = ((iVar61 + -1) - local_a90.begin.z) * local_a90.kstride;
                              local_9f0 = (_func_int ***)local_a90.p +
                                          ((iVar71 + 1) - local_a90.begin.y) * local_a90.jstride;
                              local_a00 = (_func_int ***)local_a90.p +
                                          (iVar71 - local_a90.begin.y) * local_a90.jstride;
                              lVar72 = ((iVar61 - local_a90.begin.z) + 1) * local_a90.kstride;
                              lVar75 = (iVar61 - local_a90.begin.z) * local_a90.kstride;
                              local_a08 = (FabArrayBase *)(long)local_9c8.begin.x;
                              local_a10 = (FabArrayBase *)
                                          ((_func_int ***)local_938.p +
                                          ((long)iVar71 - (long)local_938.begin.y) *
                                          local_938.jstride +
                                          ((long)iVar61 - (long)local_938.begin.z) *
                                          local_938.kstride);
                              local_a18 = (_func_int ***)(long)local_a90.begin.x;
                              local_a20 = (long)local_938.begin.x;
                              pFVar59 = local_af0._M_head_impl;
                              do {
                                iVar44 = (int)pFVar59;
                                if (*(int *)((long)local_8e8.p +
                                            ((long)pFVar59 - (long)local_8e8.begin.x) * 4 +
                                            ((long)iVar61 - (long)local_8e8.begin.z) *
                                            local_8e8.kstride * 4 +
                                            ((long)iVar71 - (long)local_8e8.begin.y) *
                                            local_8e8.jstride * 4) == 0) {
                                  lVar54 = (long)pFVar59 + (-1 - (long)local_a08);
                                  pp_Var3 = local_9e8[lVar54 + (long)local_9e0];
                                  lVar64 = (long)pFVar59 - (long)local_a08;
                                  pp_Var4 = local_9e8[lVar64 + (long)local_9e0];
                                  dVar80 = (double)pp_Var3 + (double)pp_Var4;
                                  lVar53 = lVar54 * 8 + lVar63 * 8;
                                  dVar78 = *(double *)
                                            ((long)local_9c8.p + (long)local_9e0 * 8 + lVar53);
                                  lVar74 = lVar64 * 8 + lVar63 * 8;
                                  dVar82 = *(double *)
                                            ((long)local_9c8.p + (long)local_9e0 * 8 + lVar74);
                                  dVar85 = dVar80 + dVar78 + dVar82;
                                  pp_Var5 = local_9e8[lVar54 + (long)local_9f8];
                                  pp_Var6 = local_9e8[lVar64 + (long)local_9f8];
                                  dVar7 = *(double *)
                                           ((long)local_9c8.p + (long)local_9f8 * 8 + lVar53);
                                  dVar41 = *(double *)
                                            ((long)local_9c8.p + (long)local_9f8 * 8 + lVar74);
                                  lVar54 = (long)pFVar59 + (-1 - (long)local_a18);
                                  lVar53 = lVar54 * 8 + lVar66 * 8;
                                  lVar64 = (long)((iVar44 + 1) - local_a90.begin.x);
                                  pp_Var8 = ((_func_int ***)local_a90.p)[lVar66 + lVar64 + lVar65];
                                  dVar79 = *(double *)((long)local_a90.p + lVar65 * 8 + lVar53);
                                  pp_Var9 = local_9f0[lVar54 + lVar65];
                                  pp_Var10 = local_9f0[lVar64 + lVar65];
                                  dVar83 = *(double *)((long)local_a90.p + lVar72 * 8 + lVar53);
                                  pp_Var11 = ((_func_int ***)local_a90.p)[lVar66 + lVar64 + lVar72];
                                  pp_Var12 = local_9f0[lVar54 + lVar72];
                                  pp_Var13 = local_9f0[lVar64 + lVar72];
                                  lVar70 = (long)pFVar59 - (long)local_a18;
                                  lVar74 = lVar70 * 8 + lVar66 * 8;
                                  pp_Var14 = local_9f0[lVar70 + lVar65];
                                  dVar15 = *(double *)((long)local_a90.p + lVar65 * 8 + lVar74);
                                  dVar16 = *(double *)((long)local_a90.p + lVar72 * 8 + lVar74);
                                  pp_Var17 = local_a00[lVar54 + lVar65];
                                  pp_Var18 = local_9f0[lVar70 + lVar72];
                                  pp_Var19 = local_a00[lVar64 + lVar65];
                                  pp_Var20 = local_a00[lVar54 + lVar72];
                                  pp_Var21 = local_a00[lVar64 + lVar72];
                                  pp_Var22 = ((_func_int ***)local_a90.p)[lVar66 + lVar64 + lVar75];
                                  dVar23 = *(double *)((long)local_a90.p + lVar75 * 8 + lVar53);
                                  pp_Var24 = local_9f0[lVar54 + lVar75];
                                  pp_Var25 = local_9f0[lVar64 + lVar75];
                                  pp_Var26 = local_9f0[lVar70 + lVar75];
                                  dVar27 = *(double *)((long)local_a90.p + lVar75 * 8 + lVar74);
                                  pp_Var28 = local_a00[lVar70 + lVar72];
                                  pp_Var29 = local_a00[lVar70 + lVar65];
                                  lVar53 = (long)pFVar59 - (long)local_af0._M_head_impl;
                                  *(double *)(local_4a8 + lVar53 * 8) =
                                       ((double)pp_Var3 + dVar78 + (double)pp_Var5 + dVar7) *
                                       local_848;
                                  local_1a8[lVar53 + -1] =
                                       (FabArrayBase *)
                                       ((dVar85 + (double)pp_Var5 + (double)pp_Var6 + dVar7 + dVar41
                                        ) * local_958);
                                  *(double *)(local_6a8 + lVar53 * 8) =
                                       ((double)pp_Var4 + dVar82 + (double)pp_Var6 + dVar41) *
                                       local_848;
                                  *(undefined8 *)(local_7a8 + lVar53 * 8) = 0;
                                  *(double *)(local_5a8 + lVar53 * 8) =
                                       (double)*(_func_int ***)
                                                ((long)local_a10 + ((long)pFVar59 - local_a20) * 8)
                                       - ((dVar85 * (double)pp_Var29 +
                                          ((double)pp_Var5 + (double)pp_Var6 + dVar7 + dVar41) *
                                          (double)pp_Var28) * (double)local_978 +
                                         ((dVar80 + (double)pp_Var5 + (double)pp_Var6) * dVar27 +
                                         (dVar78 + dVar82 + dVar7 + dVar41) * (double)pp_Var26) *
                                         local_818 +
                                         ((dVar82 + dVar41) * (double)pp_Var25 +
                                         (dVar78 + dVar7) * (double)pp_Var24 +
                                         ((double)pp_Var3 + (double)pp_Var5) * dVar23 +
                                         ((double)pp_Var4 + (double)pp_Var6) * (double)pp_Var22) *
                                         (double)local_988._0_8_ +
                                         (((double)pp_Var6 + dVar41) * (double)pp_Var21 +
                                         ((double)pp_Var5 + dVar7) * (double)pp_Var20 +
                                         (double)pp_Var17 * ((double)pp_Var3 + dVar78) +
                                         (double)pp_Var19 * ((double)pp_Var4 + dVar82)) *
                                         (double)local_7f8 +
                                         ((double)pp_Var13 * dVar41 +
                                         (double)pp_Var12 * dVar7 +
                                         (double)pp_Var11 * (double)pp_Var6 +
                                         dVar83 * (double)pp_Var5 +
                                         (double)pp_Var10 * dVar82 +
                                         (double)pp_Var9 * dVar78 +
                                         dVar79 * (double)pp_Var3 +
                                         (double)pp_Var8 * (double)pp_Var4) * (double)pFVar84 +
                                         ((dVar7 + dVar41) * (double)pp_Var18 +
                                         dVar16 * ((double)pp_Var5 + (double)pp_Var6) +
                                         dVar15 * dVar80 + (double)pp_Var14 * (dVar78 + dVar82)) *
                                         (double)local_808._0_8_);
                                }
                                else {
                                  lVar53 = (long)pFVar59 - (long)local_af0._M_head_impl;
                                  *(undefined8 *)(local_4a8 + lVar53 * 8) = 0;
                                  local_1a8[lVar53 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                  *(undefined8 *)(local_6a8 + lVar53 * 8) = 0;
                                  *(undefined8 *)(local_7a8 + lVar53 * 8) = 0;
                                  *(undefined8 *)(local_5a8 + lVar53 * 8) = 0;
                                }
                                pFVar59 = (FabArrayBase *)((long)&pFVar59->_vptr_FabArrayBase + 1);
                              } while (iVar44 + 1 != iVar48 + 1U);
                              local_b50._M_head_impl = (FabArrayBase *)local_1b0;
                              local_af8 = (FabArrayBase *)local_5a8._0_8_;
                              pFVar59 = local_a30;
                              local_a28 = pFVar55;
                            }
                            local_b78 = (FabArrayBase *)((double)local_af8 / local_b50._M_head_impl)
                            ;
                            local_7a8._0_8_ = local_b78;
                            if (1 < (int)uVar43) {
                              lVar63 = 0;
                              _Var77._M_head_impl = local_b50._M_head_impl;
                              do {
                                dVar78 = *(double *)(local_6a8 + lVar63);
                                *(double *)(local_2c8 + lVar63 + 8) =
                                     dVar78 / (double)_Var77._M_head_impl;
                                dVar82 = *(double *)(local_4a8 + lVar63 + 8);
                                _Var77._M_head_impl =
                                     (FabArrayBase *)
                                     (*(double *)((long)local_1a8 + lVar63) -
                                     (dVar78 / (double)_Var77._M_head_impl) * dVar82);
                                if (((double)_Var77._M_head_impl == 0.0) &&
                                   (!NAN((double)_Var77._M_head_impl))) {
                                  Abort_host(">>>TRIDIAG FAILED");
                                }
                                local_b78 = (FabArrayBase *)
                                            (((double)local_b78 * -dVar82 +
                                             *(double *)(local_5a8 + lVar63 + 8)) /
                                            (double)_Var77._M_head_impl);
                                *(FabArrayBase **)(local_7a8 + lVar63 + 8) = local_b78;
                                lVar63 = lVar63 + 8;
                              } while (pFVar59 != (FabArrayBase *)lVar63);
                              if (1 < (int)uVar43) {
                                dVar78 = *(double *)(local_7a8 + (long)local_a40 * 8 + 8);
                                pFVar55 = local_a48;
                                do {
                                  dVar78 = (&local_7b0)[(long)pFVar55] -
                                           dVar78 * *(double *)(local_2c8 + (long)pFVar55 * 8);
                                  (&local_7b0)[(long)pFVar55] = dVar78;
                                  pFVar45 = pFVar55 + -1;
                                  bVar76 = 0 < (long)pFVar55;
                                  pFVar55 = (FabArrayBase *)&pFVar45->field_0xef;
                                } while (&pFVar45->field_0xef != (undefined1 *)0x0 && bVar76);
                              }
                            }
                            if (iVar47 <= iVar48) {
                              memcpy((void *)((long)local_a90.p +
                                             ((long)iVar61 - (long)local_a90.begin.z) *
                                             local_a90.kstride * 8 +
                                             ((long)iVar71 - (long)local_a90.begin.y) *
                                             local_a90.jstride * 8 + (long)local_a90.begin.x * -8 +
                                             (long)local_af0._M_head_impl * 8),local_7a8,local_a38);
                            }
                            pFVar55 = (FabArrayBase *)(ulong)(iVar61 + 1);
                          } while (iVar61 != iVar50);
                        }
                        iVar71 = iVar71 + 1;
                      } while (iVar71 != iVar49 + 1);
                    }
                  }
                  else {
                    Abort_host("mlndlap_gauss_seidel_with_line_solve_aa is wrong direction.");
                  }
                  local_9d0 = local_9d0 + 1;
                } while (local_9d0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
              }
            }
            else if (0 < iVar71) {
              iVar71 = 0;
              do {
                pFStack_488 = (FabArrayBase *)CONCAT44(local_8e8.begin.y,local_8e8.begin.x);
                uStack_474 = local_8e8._52_8_;
                local_4a8._16_8_ = local_8e8.kstride;
                pFStack_490 = (FabArrayBase *)local_8e8.nstride;
                local_4a8._0_8_ = local_8e8.p;
                local_4a8._8_8_ = local_8e8.jstride;
                pFStack_448 = (FabArrayBase *)CONCAT44(local_a90.begin.y,local_a90.begin.x);
                uStack_434 = local_a90._52_8_;
                local_458 = (FabArrayBase *)local_a90.kstride;
                pFStack_450 = (FabArrayBase *)local_a90.nstride;
                local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                     (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                     (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_a90.p;
                pFStack_460 = (FabArrayBase *)local_a90.jstride;
                uStack_3f0 = local_9c8.end.y;
                iStack_3ec = local_9c8.end.z;
                local_3e8 = local_9c8.ncomp;
                iStack_400 = local_9c8.begin.x;
                local_3fc = local_9c8.begin.y;
                uStack_3f8._0_4_ = local_9c8.begin.z;
                uStack_3f8._4_4_ = local_9c8.end.x;
                pFStack_410 = (FabArrayBase *)local_9c8.kstride;
                pFStack_408 = (FabArrayBase *)local_9c8.nstride;
                tStack_420.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        )local_9c8.p;
                local_418 = (FabArrayBase *)local_9c8.jstride;
                pFStack_3e0 = local_1c8;
                local_3d8 = pFStack_1c0;
                pFStack_3d0 = (FabArrayBase *)local_988._0_8_;
                local_3c8 = SUB84(local_848,0);
                iStack_3c4 = (int)((ulong)local_848 >> 0x20);
                iStack_3c0 = SUB84(dStack_840,0);
                iStack_3bc = (int)((ulong)dStack_840 >> 0x20);
                iStack_3b8 = (int)local_978;
                iStack_3b4 = (int)((ulong)local_978 >> 0x20);
                pFStack_390 = (FabArrayBase *)CONCAT44(local_938.begin.y,local_938.begin.x);
                iStack_378 = local_938.end.y;
                local_380 = local_938.end.y;
                iStack_37c = local_938.end.z;
                iStack_388 = local_938.begin.z;
                iStack_384 = local_938.end.x;
                iStack_3a0 = (int)local_938.kstride;
                uStack_39c = (undefined4)((ulong)local_938.kstride >> 0x20);
                local_398 = (FabArrayBase *)local_938.nstride;
                iStack_3b0 = (int)local_938.p;
                iStack_3ac = (int)((ulong)local_938.p >> 0x20);
                uStack_3a8._0_4_ = (int)local_938.jstride;
                uStack_3a8._4_4_ = (int)((ulong)local_938.jstride >> 0x20);
                local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                     (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                     (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)pFVar84;
                Loop<amrex::mlndlap_gauss_seidel_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                          (&local_834,(anon_class_312_11_b8f6ed96 *)local_4a8);
                iVar71 = iVar71 + 1;
              } while (iVar71 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
            }
            MFIter::operator++((MFIter *)local_8a8);
          } while (local_888 < iStack_880);
        }
        MFIter::~MFIter((MFIter *)local_8a8);
        goto LAB_006b3514;
      }
      MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
      if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
        do {
          BATransformer::operator()
                    ((Box *)&local_a90,&(local_1a8[0]->boxarray).m_bat,
                     (Box *)((long)*(int *)(*(long *)local_1a8[6] +
                                           (long)(int)local_1a8[3]._0_4_ * 4) * 0x1c +
                            *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_6a8,(FabArray<amrex::FArrayBox> *)*plVar68,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7a8,(FabArray<amrex::FArrayBox> *)plVar68[1],
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5a8,(FabArray<amrex::FArrayBox> *)plVar68[2],
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_2c8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8a8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_9c8,this_00,(MFIter *)local_1b0);
          if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
            iVar71 = 0;
            do {
              pFStack_488 = (FabArrayBase *)CONCAT44(local_9c8.begin.y,local_9c8.begin.x);
              uStack_474 = local_9c8._52_8_;
              local_4a8._16_8_ = local_9c8.kstride;
              pFStack_490 = (FabArrayBase *)local_9c8.nstride;
              local_4a8._0_8_ = local_9c8.p;
              local_4a8._8_8_ = local_9c8.jstride;
              uStack_434 = local_2c8._52_8_;
              pFStack_448 = (FabArrayBase *)local_2c8._32_8_;
              local_458 = (FabArrayBase *)local_2c8._16_8_;
              pFStack_450 = (FabArrayBase *)local_2c8._24_8_;
              local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_2c8._0_8_;
              pFStack_460 = (FabArrayBase *)local_2c8._8_8_;
              uStack_3f0 = IStack_678.itype;
              iStack_3ec = (int)uStack_674;
              local_3e8 = SUB84(uStack_674,4);
              iStack_400 = local_688;
              local_3fc = iStack_684;
              uStack_3f8._0_4_ = iStack_680;
              uStack_3f8._4_4_ = iStack_67c;
              pFStack_410 = (FabArrayBase *)local_6a8._16_8_;
              pFStack_408 = pFStack_690;
              tStack_420.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )local_6a8._0_8_;
              local_418 = (FabArrayBase *)local_6a8._8_8_;
              uStack_3a8._0_4_ = iStack_778;
              uStack_3a8._4_4_ = (int)uStack_774;
              iStack_3a0 = SUB84(uStack_774,4);
              iStack_3b8 = (int)local_7a8._32_8_;
              iStack_3b4 = SUB84(local_7a8._32_8_,4);
              iStack_3b0 = iStack_780;
              iStack_3ac = iStack_77c;
              local_3c8 = (int)local_7a8._16_8_;
              iStack_3c4 = SUB84(local_7a8._16_8_,4);
              iStack_3c0 = (int)local_7a8._24_8_;
              iStack_3bc = SUB84(local_7a8._24_8_,4);
              local_3d8 = (FabArrayBase *)local_7a8._0_8_;
              pFStack_3d0 = (FabArrayBase *)local_7a8._8_8_;
              uStack_360._4_4_ = (int)uStack_574;
              iStack_358 = SUB84(uStack_574,4);
              iStack_370 = (int)local_5a8._32_8_;
              iStack_36c = SUB84(local_5a8._32_8_,4);
              local_380 = (int)local_5a8._16_8_;
              iStack_37c = SUB84(local_5a8._16_8_,4);
              iStack_378 = (int)local_5a8._24_8_;
              iStack_374 = SUB84(local_5a8._24_8_,4);
              pFStack_390 = (FabArrayBase *)local_5a8._0_8_;
              iStack_388 = (int)local_5a8._8_8_;
              iStack_384 = SUB84(local_5a8._8_8_,4);
              local_340 = (FabArrayBase *)local_8a8._16_8_;
              pFStack_338 = pFStack_890;
              local_350 = (FabArrayBase *)local_8a8._0_8_;
              pFStack_348 = (FabArrayBase *)local_8a8._8_8_;
              local_428.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (FabArrayBase *)(dVar82 * 0.027777777777777776 * dVar82);
              pFStack_3e0 = (FabArrayBase *)(dVar7 * 0.027777777777777776 * dVar7);
              local_398 = (FabArrayBase *)(dVar78 * 0.027777777777777776 * dVar78);
              Loop<amrex::mlndlap_gauss_seidel_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)&local_a90,(anon_class_408_9_11dfeee2 *)local_4a8);
              iVar71 = iVar71 + 1;
            } while (iVar71 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
      }
    }
    MFIter::~MFIter((MFIter *)local_1b0);
  }
LAB_006b3514:
  MLNodeLinOp::nodalSync(&this->super_MLNodeLinOp,local_9d4,local_94c,sol);
  return;
}

Assistant:

void
MLNodeLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs) const
{
    BL_PROFILE("MLNodeLaplacian::Fsmooth()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto solarr_ma = sol.arrays();
        auto rhsarr_ma = rhs.const_arrays();
        auto dmskarr_ma = dmsk.const_arrays();
        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto starr_ma = stencil->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_sten(i,j,k,solarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                    mlndlap_jacobi_sten(i,j,k,solarr_ma[box_no],Ax,rhsarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                });
            }
        }
        else if (sigma[0] == nullptr)
        {
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                Real const_sigma = m_const_sigma;
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_c(i,j,k,solarr_ma[box_no],const_sigma,dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                              is_rz,
#endif
                                              dxinvarr);
                    mlndlap_jacobi_c(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], const_sigma,
                                     dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else if ((m_use_harmonic_average && mglev > 0) || m_use_mapped)
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_ha(i,j,k,solarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_ha(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]),
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_aa(i,j,k,solarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_aa(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], sarr_ma[box_no],
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }

        Gpu::streamSynchronize();
        if (m_smooth_num_sweeps > 1) nodalSync(amrlev, mglev, sol);
    }
    else // cpu
#endif
    {
        bool regular_coarsening = true;
        if (amrlev == 0 && mglev > 0)
        {
            regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
        }
        if (sigma[0] == nullptr) {
            AMREX_ALWAYS_ASSERT(regular_coarsening);
        }

        if (m_use_gauss_seidel)
        {
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& starr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_sten(bx,solarr,rhsarr,starr,dmskarr);
                    }
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_c(bx, solarr, rhsarr,
                                               const_sigma, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                               ,is_rz
#endif
                            );
                    }
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_ha(bx, solarr, rhsarr,
                                                AMREX_D_DECL(sxarr,syarr,szarr),
                                                dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                ,is_rz
#endif
                            );
                    }
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {

                    const Box& bx = mfi.validbox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    if ( regular_coarsening )
                    {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_aa(bx, solarr, rhsarr,
                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                   ,is_rz
#endif
                                 );
                        }
                    } else {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_with_line_solve_aa(bx, solarr, rhsarr,
                                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                                   ,is_rz
#endif
                                );
                        }
                    }
                }
            }

            nodalSync(amrlev, mglev, sol);
        }
        else
        {
            MultiFab Ax(sol.boxArray(), sol.DistributionMap(), 1, 0);
            Fapply(amrlev, mglev, Ax, sol);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& stenarr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_sten(bx,solarr,Axarr,rhsarr,stenarr,dmskarr);
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_c (bx, solarr, Axarr, rhsarr, const_sigma,
                                      dmskarr, dxinvarr);
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_ha (bx, solarr, Axarr, rhsarr, AMREX_D_DECL(sxarr,syarr,szarr),
                                       dmskarr, dxinvarr);
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_aa (bx, solarr, Axarr, rhsarr, sarr,
                                       dmskarr, dxinvarr);
                }
            }
        }
    }
}